

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_randomnumberutil.cpp
# Opt level: O0

void __thiscall
RandomNumberUtil_GetRandomIndexesEmpty_Test::TestBody
          (RandomNumberUtil_GetRandomIndexesEmpty_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_70;
  Message local_68 [3];
  unsigned_long local_50;
  size_type local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  uint32_t length;
  RandomNumberUtil_GetRandomIndexesEmpty_Test *this_local;
  
  cfd::core::RandomNumberUtil::GetRandomIndexes
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&gtest_ar.message_,0);
  local_48 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&gtest_ar.message_);
  local_50 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_40,"indexes.size()","static_cast<size_t>(length)",&local_48,
             &local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x40,message);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(RandomNumberUtil, GetRandomIndexesEmpty) {
  uint32_t length = 0;
  std::vector<uint32_t> indexes = RandomNumberUtil::GetRandomIndexes(length);
  EXPECT_EQ(indexes.size(), static_cast<size_t>(length));
}